

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int fillpara(int f,int n)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  byte abStack_148 [8];
  char wbuf [256];
  line *local_40;
  line *eopline;
  int retval;
  int eolflag;
  int newlength;
  int firstflag;
  int eopflag;
  int i;
  int clength;
  int wordlen;
  int c;
  int n_local;
  int f_local;
  
  if (n == 0) {
    n_local = 1;
  }
  else {
    undo_boundary_enable(8,0);
    gotoeop(8,1);
    if (curwp->w_doto == 0) {
      local_40 = curwp->w_dotp;
    }
    else {
      lnewline();
      local_40 = curwp->w_dotp->l_fp;
    }
    gotobop(8,1);
    do {
      iVar3 = inword();
      bVar4 = false;
      if (iVar3 == 0) {
        iVar3 = forwchar(8,1);
        bVar4 = iVar3 != 0;
      }
    } while (bVar4);
    eopflag = curwp->w_doto;
    i = 0;
    bVar2 = true;
    bVar4 = false;
    while (!bVar4) {
      bVar5 = curwp->w_doto == curwp->w_dotp->l_used;
      if (bVar5) {
        clength = 0x20;
        if (curwp->w_dotp->l_fp == local_40) {
          bVar4 = true;
        }
      }
      else {
        clength = (int)(byte)curwp->w_dotp->l_text[curwp->w_doto];
      }
      iVar3 = ldelete(1,0);
      if ((iVar3 == 0) && (!bVar4)) {
        eopline._0_4_ = 0;
        goto LAB_0011b021;
      }
      if ((clength == 0x20) || (clength == 9)) {
        if (i != 0) {
          iVar3 = eopflag + 1 + i;
          if (((((dblspace != 0) && (!bVar4)) &&
               ((bVar5 || (((curwp->w_doto == curwp->w_dotp->l_used ||
                            (cVar1 = curwp->w_dotp->l_text[curwp->w_doto], cVar1 == ' ')) ||
                           (cVar1 == '\t')))))) &&
              (((cinfo[abStack_148[i + -1]] & 0x10U) != 0 ||
               (((abStack_148[i + -1] == 0x29 && (1 < i)) &&
                ((cinfo[abStack_148[i + -2]] & 0x10U) != 0)))))) && (i < 0xff)) {
            abStack_148[i] = 0x20;
            i = i + 1;
          }
          if (fillcol < iVar3) {
            if ((0 < curwp->w_doto) && (curwp->w_dotp->l_text[curwp->w_doto + -1] == ' ')) {
              curwp->w_doto = curwp->w_doto + -1;
              ldelete(1,0);
            }
            lnewline();
            eopflag = 0;
          }
          else {
            if (!bVar2) {
              linsert(1,0x20);
              eopflag = eopflag + 1;
            }
            bVar2 = false;
          }
          for (firstflag = 0; firstflag < i; firstflag = firstflag + 1) {
            linsert(1,(int)(char)abStack_148[firstflag]);
            eopflag = eopflag + 1;
          }
          i = 0;
        }
      }
      else if (i < 0xff) {
        abStack_148[i] = (byte)clength;
        i = i + 1;
      }
      else {
        ewprintf("Word too long!");
      }
    }
    lnewline();
    backchar(8,1);
    eopline._0_4_ = 1;
LAB_0011b021:
    undo_boundary_enable(8,1);
    n_local = (int)eopline;
  }
  return n_local;
}

Assistant:

int
fillpara(int f, int n)
{
	int	 c;		/* current char during scan		*/
	int	 wordlen;	/* length of current word		*/
	int	 clength;	/* position on line during fill		*/
	int	 i;		/* index during word copy		*/
	int	 eopflag;	/* Are we at the End-Of-Paragraph?	*/
	int	 firstflag;	/* first word? (needs no space)		*/
	int	 newlength;	/* tentative new line length		*/
	int	 eolflag;	/* was at end of line			*/
	int	 retval;	/* return value				*/
	struct line	*eopline;	/* pointer to line just past EOP	*/
	char	 wbuf[MAXWORD];	/* buffer for current word		*/

	if (n == 0)
		return (TRUE);

	undo_boundary_enable(FFRAND, 0);

	/* record the pointer to the line just past the EOP */
	(void)gotoeop(FFRAND, 1);
	if (curwp->w_doto != 0) {
		/* paragraph ends at end of buffer */
		(void)lnewline();
		eopline = lforw(curwp->w_dotp);
	} else
		eopline = curwp->w_dotp;

	/* and back top the beginning of the paragraph */
	(void)gotobop(FFRAND, 1);

	/* initialize various info */
	while (inword() == 0 && forwchar(FFRAND, 1));

	clength = curwp->w_doto;
	wordlen = 0;

	/* scan through lines, filling words */
	firstflag = TRUE;
	eopflag = FALSE;
	while (!eopflag) {

		/* get the next character in the paragraph */
		if ((eolflag = (curwp->w_doto == llength(curwp->w_dotp)))) {
			c = ' ';
			if (lforw(curwp->w_dotp) == eopline)
				eopflag = TRUE;
		} else
			c = lgetc(curwp->w_dotp, curwp->w_doto);

		/* and then delete it */
		if (ldelete((RSIZE) 1, KNONE) == FALSE && !eopflag) {
			retval = FALSE;
			goto cleanup;
		}

		/* if not a separator, just add it in */
		if (c != ' ' && c != '\t') {
			if (wordlen < MAXWORD - 1)
				wbuf[wordlen++] = c;
			else {
				/*
				 * You lose chars beyond MAXWORD if the word
				 * is too long. I'm too lazy to fix it now; it
				 * just silently truncated the word before,
				 * so I get to feel smug.
				 */
				ewprintf("Word too long!");
			}
		} else if (wordlen) {

			/* calculate tentative new length with word added */
			newlength = clength + 1 + wordlen;

			/*
			 * if at end of line or at doublespace and previous
			 * character was one of '.','?','!' doublespace here.
			 * behave the same way if a ')' is preceded by a
			 * [.?!] and followed by a doublespace.
			 */
			if (dblspace && (!eopflag && ((eolflag ||
			    curwp->w_doto == llength(curwp->w_dotp) ||
			    (c = lgetc(curwp->w_dotp, curwp->w_doto)) == ' '
			    || c == '\t') && (ISEOSP(wbuf[wordlen - 1]) ||
			    (wbuf[wordlen - 1] == ')' && wordlen >= 2 &&
			    ISEOSP(wbuf[wordlen - 2])))) &&
			    wordlen < MAXWORD - 1))
				wbuf[wordlen++] = ' ';

			/* at a word break with a word waiting */
			if (newlength <= fillcol) {
				/* add word to current line */
				if (!firstflag) {
					(void)linsert(1, ' ');
					++clength;
				}
				firstflag = FALSE;
			} else {
				if (curwp->w_doto > 0 &&
				    lgetc(curwp->w_dotp, curwp->w_doto - 1) == ' ') {
					curwp->w_doto -= 1;
					(void)ldelete((RSIZE) 1, KNONE);
				}
				/* start a new line */
				(void)lnewline();
				clength = 0;
			}

			/* and add the word in in either case */
			for (i = 0; i < wordlen; i++) {
				(void)linsert(1, wbuf[i]);
				++clength;
			}
			wordlen = 0;
		}
	}
	/* and add a last newline for the end of our new paragraph */
	(void)lnewline();

	/*
	 * We really should wind up where we started, (which is hard to keep
	 * track of) but I think the end of the last line is better than the
	 * beginning of the blank line.
	 */
	(void)backchar(FFRAND, 1);
	retval = TRUE;
cleanup:
	undo_boundary_enable(FFRAND, 1);
	return (retval);
}